

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

mp_int * monty_add(MontyContext *mc,mp_int *x,mp_int *y)

{
  mp_int *pmVar1;
  mp_int *y_local;
  mp_int *x_local;
  MontyContext *mc_local;
  
  pmVar1 = mp_modadd_in_range(x,y,mc->m);
  return pmVar1;
}

Assistant:

mp_int *monty_add(MontyContext *mc, mp_int *x, mp_int *y)
{
    return mp_modadd_in_range(x, y, mc->m);
}